

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall SuiteMessageTests::TestoutOfOrder::RunImpl(TestoutOfOrder *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  string local_1a0;
  TestDetails local_180;
  Message object;
  
  FIX::Message::Message(&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "54=1\x0120=0\x0131=109.03125\x0160=00000000-00:00:00\x018=FIX.4.2\x016=109.03125\x011=acct1\x01151=0\x01150=2\x0117=2\x0139=2\x0138=3000\x0149=MEK\x0115=USD\x0137=1\x0148=123ABC789\x0114=3000\x0135=8\x0156=KEM\x0134=2\x0155=ABCD\x0111=ID1\x0122=1\x01"
             ,(allocator<char> *)&local_180);
  FIX::Message::setString(&object,&local_1a0,false);
  std::__cxx11::string::~string((string *)&local_1a0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  FIX::Message::toString_abi_cxx11_((int)&local_1a0,(int)&object,8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_180,*ppTVar2,0x1a2);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>
            (results,&RunImpl::expected,&local_1a0,&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  FIX::Message::~Message(&object);
  return;
}

Assistant:

TEST(outOfOrder)
{
  FIX::Message object;
  static const char * str =
    "54=1\00120=0\00131=109.03125\00160=00000000-00:00:00\001"
    "8=FIX.4.2\0016=109.03125\0011=acct1\001151=0\001150=2\001"
    "17=2\00139=2\00138=3000\00149=MEK\00115=USD\00137=1\001"
    "48=123ABC789\00114=3000\00135=8\00156=KEM\00134=2\001"
    "55=ABCD\00111=ID1\00122=1\001";

  static const char * expected =
    "8=FIX.4.2\0019=171\00135=8\00134=2\00149=MEK\00156=KEM\0011=acct1\001"
    "6=109.03125\00111=ID1\00114=3000\00115=USD\00117=2\00120=0\00122=1\001"
    "31=109.03125\00137=1\00138=3000\00139=2\00148=123ABC789\001"
    "54=1\00155=ABCD\00160=00000000-00:00:00\001150=2\001151=0\00110=225\001";

  object.setString( str, false );
  CHECK_EQUAL( expected, object.toString() );
}